

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS UnmarshalFloat(JlDataObject *NumberObject,void *Output,size_t FixedSize)

{
  float *OutputF32;
  double *OutputF64;
  double number;
  size_t sStack_20;
  JL_STATUS jlStatus;
  size_t FixedSize_local;
  void *Output_local;
  JlDataObject *NumberObject_local;
  
  OutputF64 = (double *)0x0;
  sStack_20 = FixedSize;
  FixedSize_local = (size_t)Output;
  Output_local = NumberObject;
  number._4_4_ = JlGetObjectNumberF64(NumberObject,(double *)&OutputF64);
  if (number._4_4_ == JL_STATUS_SUCCESS) {
    if (sStack_20 == 4) {
      if ((3.4028234663852886e+38 < (double)OutputF64) ||
         ((double)OutputF64 < 1.1754943508222875e-38)) {
        number._4_4_ = JL_STATUS_VALUE_OUT_OF_RANGE;
      }
      else {
        *(float *)FixedSize_local = (float)(double)OutputF64;
      }
    }
    else if (sStack_20 == 8) {
      *(double **)FixedSize_local = OutputF64;
    }
    else {
      number._4_4_ = JL_STATUS_INVALID_SPECIFICATION;
    }
  }
  return number._4_4_;
}

Assistant:

static
JL_STATUS
    UnmarshalFloat
    (
        JlDataObject const*         NumberObject,
        void*                       Output,
        size_t                      FixedSize
    )
{
    JL_STATUS jlStatus;
    double number = 0.0;

    jlStatus = JlGetObjectNumberF64( NumberObject, &number );
    if( JL_STATUS_SUCCESS == jlStatus )
    {
        switch( FixedSize )
        {
        case sizeof(double):
        {
            double* OutputF64 = Output;
            *OutputF64 = number;
            break;
        }
        case sizeof(float):
        {
            float* OutputF32 = Output;
            if( number <= FLT_MAX && number >= FLT_MIN ) { *OutputF32 = (float) number;  }
            else                                         { jlStatus = JL_STATUS_VALUE_OUT_OF_RANGE;  }
            break;
        }
        default:
            jlStatus = JL_STATUS_INVALID_SPECIFICATION;
            break;
        }
    }

    return jlStatus;
}